

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O2

size_t ZSTD_writeFrameHeader
                 (void *dst,size_t dstCapacity,ZSTD_CCtx_params *params,U64 pledgedSrcSize,
                 U32 dictID)

{
  byte bVar1;
  int iVar2;
  int iVar3;
  size_t sVar4;
  ulong uVar5;
  int iVar6;
  uint uVar7;
  bool bVar8;
  
  uVar7 = (((uint)(dictID != 0) - (uint)(dictID < 0x100)) + 2) - (uint)(dictID < 0x10000);
  iVar6 = 0;
  if ((params->fParams).noDictIDFlag != 0) {
    uVar7 = 0;
  }
  bVar1 = (byte)(params->cParams).windowLog;
  iVar2 = (params->fParams).contentSizeFlag;
  bVar8 = pledgedSrcSize <= (ulong)(1L << (bVar1 & 0x3f));
  iVar3 = (params->fParams).checksumFlag;
  if (iVar2 != 0) {
    iVar6 = (uint)(0xfffffffe < pledgedSrcSize) +
            (((0xff < pledgedSrcSize) + 1) - (uint)(pledgedSrcSize < 0x10100));
  }
  if (pledgedSrcSize != 0xffffffffffffffff || iVar2 == 0) {
    if (dstCapacity < 0x12) {
      return 0xffffffffffffffba;
    }
    if (params->format == ZSTD_f_zstd1) {
      *(undefined4 *)dst = 0xfd2fb528;
      uVar5 = 4;
    }
    else {
      uVar5 = 0;
    }
    *(byte *)((long)dst + uVar5) =
         (byte)(iVar6 << 6) | (char)uVar7 + (0 < iVar3) * '\x04' | (iVar2 != 0 && bVar8) << 5;
    if (iVar2 == 0 || !bVar8) {
      *(byte *)((long)dst + (uVar5 | 1)) = bVar1 * '\b' + -0x50;
    }
    sVar4 = (*(code *)((long)&DAT_0023ed48 + (long)(int)(&DAT_0023ed48)[uVar7]))
                      (dst,(code *)((long)&DAT_0023ed48 + (long)(int)(&DAT_0023ed48)[uVar7]),
                       &DAT_0023ed48,iVar6);
    return sVar4;
  }
  __assert_fail("!(params->fParams.contentSizeFlag && pledgedSrcSize == ZSTD_CONTENTSIZE_UNKNOWN)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress.c"
                ,0x1187,
                "size_t ZSTD_writeFrameHeader(void *, size_t, const ZSTD_CCtx_params *, U64, U32)");
}

Assistant:

static size_t ZSTD_writeFrameHeader(void* dst, size_t dstCapacity,
                                    const ZSTD_CCtx_params* params, U64 pledgedSrcSize, U32 dictID)
{   BYTE* const op = (BYTE*)dst;
    U32   const dictIDSizeCodeLength = (dictID>0) + (dictID>=256) + (dictID>=65536);   /* 0-3 */
    U32   const dictIDSizeCode = params->fParams.noDictIDFlag ? 0 : dictIDSizeCodeLength;   /* 0-3 */
    U32   const checksumFlag = params->fParams.checksumFlag>0;
    U32   const windowSize = (U32)1 << params->cParams.windowLog;
    U32   const singleSegment = params->fParams.contentSizeFlag && (windowSize >= pledgedSrcSize);
    BYTE  const windowLogByte = (BYTE)((params->cParams.windowLog - ZSTD_WINDOWLOG_ABSOLUTEMIN) << 3);
    U32   const fcsCode = params->fParams.contentSizeFlag ?
                     (pledgedSrcSize>=256) + (pledgedSrcSize>=65536+256) + (pledgedSrcSize>=0xFFFFFFFFU) : 0;  /* 0-3 */
    BYTE  const frameHeaderDescriptionByte = (BYTE)(dictIDSizeCode + (checksumFlag<<2) + (singleSegment<<5) + (fcsCode<<6) );
    size_t pos=0;

    assert(!(params->fParams.contentSizeFlag && pledgedSrcSize == ZSTD_CONTENTSIZE_UNKNOWN));
    RETURN_ERROR_IF(dstCapacity < ZSTD_FRAMEHEADERSIZE_MAX, dstSize_tooSmall,
                    "dst buf is too small to fit worst-case frame header size.");
    DEBUGLOG(4, "ZSTD_writeFrameHeader : dictIDFlag : %u ; dictID : %u ; dictIDSizeCode : %u",
                !params->fParams.noDictIDFlag, (unsigned)dictID, (unsigned)dictIDSizeCode);
    if (params->format == ZSTD_f_zstd1) {
        MEM_writeLE32(dst, ZSTD_MAGICNUMBER);
        pos = 4;
    }
    op[pos++] = frameHeaderDescriptionByte;
    if (!singleSegment) op[pos++] = windowLogByte;
    switch(dictIDSizeCode)
    {
        default:
            assert(0); /* impossible */
            ZSTD_FALLTHROUGH;
        case 0 : break;
        case 1 : op[pos] = (BYTE)(dictID); pos++; break;
        case 2 : MEM_writeLE16(op+pos, (U16)dictID); pos+=2; break;
        case 3 : MEM_writeLE32(op+pos, dictID); pos+=4; break;
    }
    switch(fcsCode)
    {
        default:
            assert(0); /* impossible */
            ZSTD_FALLTHROUGH;
        case 0 : if (singleSegment) op[pos++] = (BYTE)(pledgedSrcSize); break;
        case 1 : MEM_writeLE16(op+pos, (U16)(pledgedSrcSize-256)); pos+=2; break;
        case 2 : MEM_writeLE32(op+pos, (U32)(pledgedSrcSize)); pos+=4; break;
        case 3 : MEM_writeLE64(op+pos, (U64)(pledgedSrcSize)); pos+=8; break;
    }
    return pos;
}